

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O0

void __thiscall Js::JavascriptSet::AddToEmptySet(JavascriptSet *this,Var value)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *pRVar4;
  BVSparse<Memory::Recycler> *this_00;
  BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_02;
  MapOrSetDataNode<void_*> *local_100;
  SetDataNode *node;
  undefined8 local_f0;
  TrackAllocData local_e8;
  BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *local_c0;
  ComplexVarDataSet *newComplexSet;
  SetDataNode *node_1;
  undefined8 local_a8;
  TrackAllocData local_a0;
  BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *local_78;
  SimpleVarDataSet *newSimpleSet;
  Var simpleVar;
  undefined8 local_60;
  TrackAllocData local_58;
  BVSparse<Memory::Recycler> *local_30;
  BVSparse<Memory::Recycler> *newIntSet;
  Var pvStack_20;
  int32 intVal;
  Var taggedInt;
  Var value_local;
  JavascriptSet *this_local;
  
  taggedInt = value;
  value_local = this;
  if (this->kind != EmptySet) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x13e,"(this->kind == SetKind::EmptySet)",
                                "this->kind == SetKind::EmptySet");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pvStack_20 = JavascriptConversion::TryCanonicalizeAsTaggedInt<false,false>(taggedInt);
  if (pvStack_20 == (Var)0x0) {
    newSimpleSet = (SimpleVarDataSet *)
                   JavascriptConversion::TryCanonicalizeAsSimpleVar<false>(taggedInt);
    if (newSimpleSet == (SimpleVarDataSet *)0x0) {
      pRVar4 = RecyclableObject::GetRecycler((RecyclableObject *)this);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_e8,
                 (type_info *)
                 &JsUtil::
                  BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                 ,0x15c);
      pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_e8);
      node = (SetDataNode *)Memory::Recycler::AllocInlined;
      local_f0 = 0;
      this_02 = (BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::Recycler>(0x38,pRVar4,0x43c4b0);
      pRVar4 = RecyclableObject::GetRecycler((RecyclableObject *)this);
      JsUtil::
      BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(this_02,pRVar4,0);
      local_c0 = this_02;
      pRVar4 = RecyclableObject::GetRecycler((RecyclableObject *)this);
      local_100 = MapOrSetDataList<void_*>::Append(&this->list,&taggedInt,pRVar4);
      JsUtil::
      BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Add(local_c0,&taggedInt,&local_100);
      Memory::
      WriteBarrierPtr<JsUtil::BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
      ::operator=((WriteBarrierPtr<JsUtil::BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                   *)&(this->u).simpleVarSet,local_c0);
      this->kind = ComplexVarSet;
    }
    else {
      pRVar4 = RecyclableObject::GetRecycler((RecyclableObject *)this);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_a0,
                 (type_info *)
                 &JsUtil::
                  BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                 ,0x152);
      pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_a0);
      node_1 = (SetDataNode *)Memory::Recycler::AllocInlined;
      local_a8 = 0;
      this_01 = (BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::Recycler>(0x38,pRVar4,0x43c4b0);
      pRVar4 = RecyclableObject::GetRecycler((RecyclableObject *)this);
      JsUtil::
      BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(this_01,pRVar4,0);
      local_78 = this_01;
      pRVar4 = RecyclableObject::GetRecycler((RecyclableObject *)this);
      newComplexSet =
           (ComplexVarDataSet *)MapOrSetDataList<void_*>::Append(&this->list,&newSimpleSet,pRVar4);
      JsUtil::
      BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Add(local_78,&newSimpleSet,(MapOrSetDataNode<void_*> **)&newComplexSet);
      Memory::
      WriteBarrierPtr<JsUtil::BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
      ::operator=(&(this->u).simpleVarSet,local_78);
      this->kind = SimpleVarSet;
    }
  }
  else {
    newIntSet._4_4_ = TaggedInt::ToInt32(pvStack_20);
    pRVar4 = RecyclableObject::GetRecycler((RecyclableObject *)this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,(type_info *)&BVSparse<Memory::Recycler>::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
               ,0x145);
    pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_58);
    simpleVar = Memory::Recycler::AllocInlined;
    local_60 = 0;
    this_00 = (BVSparse<Memory::Recycler> *)new<Memory::Recycler>(0x20,pRVar4,0x43c4b0);
    pRVar4 = RecyclableObject::GetRecycler((RecyclableObject *)this);
    BVSparse<Memory::Recycler>::BVSparse(this_00,pRVar4);
    local_30 = this_00;
    BVSparse<Memory::Recycler>::Set(this_00,newIntSet._4_4_);
    pRVar4 = RecyclableObject::GetRecycler((RecyclableObject *)this);
    MapOrSetDataList<void_*>::Append(&this->list,&stack0xffffffffffffffe0,pRVar4);
    Memory::WriteBarrierPtr<BVSparse<Memory::Recycler>_>::operator=
              ((WriteBarrierPtr<BVSparse<Memory::Recycler>_> *)&(this->u).simpleVarSet,local_30);
    this->kind = IntSet;
  }
  return;
}

Assistant:

void
JavascriptSet::AddToEmptySet(Var value)
{
    Assert(this->kind == SetKind::EmptySet);
    // We cannot store an int with value -1 inside of a bit vector
    Var taggedInt = JavascriptConversion::TryCanonicalizeAsTaggedInt<false /* allowNegOne */, false /* allowLossyConversion */>(value);
    if (taggedInt)
    {
        int32 intVal = TaggedInt::ToInt32(taggedInt);

        BVSparse<Recycler>* newIntSet = RecyclerNew(this->GetRecycler(), BVSparse<Recycler>, this->GetRecycler());
        newIntSet->Set(intVal);

        this->list.Append(taggedInt, this->GetRecycler());

        this->u.intSet = newIntSet;
        this->kind = SetKind::IntSet;
        return;
    }

    Var simpleVar = JavascriptConversion::TryCanonicalizeAsSimpleVar<false /* allowLossyConversion */>(value);
    if (simpleVar)
    {
        SimpleVarDataSet* newSimpleSet = RecyclerNew(this->GetRecycler(), SimpleVarDataSet, this->GetRecycler());
        SetDataNode* node = this->list.Append(simpleVar, this->GetRecycler());

        newSimpleSet->Add(simpleVar, node);

        this->u.simpleVarSet = newSimpleSet;
        this->kind = SetKind::SimpleVarSet;
        return;
    }

    ComplexVarDataSet* newComplexSet = RecyclerNew(this->GetRecycler(), ComplexVarDataSet, this->GetRecycler());
    SetDataNode* node = this->list.Append(value, this->GetRecycler());

    newComplexSet->Add(value, node);

    this->u.complexVarSet = newComplexSet;
    this->kind = SetKind::ComplexVarSet;
}